

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTransformers.cpp
# Opt level: O3

void iDynTree::buildLinkToAdditionalFramesList
               (Model *fullModel,
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *link2additionalFramesAdjacencyList)

{
  vector<long,std::allocator<long>> *this;
  iterator __position;
  size_t sVar1;
  size_t sVar2;
  LinkIndex LVar3;
  size_t local_28;
  
  sVar1 = Model::getNrOfLinks(fullModel);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::resize(link2additionalFramesAdjacencyList,sVar1);
  sVar1 = Model::getNrOfLinks(fullModel);
  local_28 = sVar1;
  sVar2 = Model::getNrOfFrames(fullModel);
  if ((long)sVar1 < (long)sVar2) {
    do {
      LVar3 = Model::getFrameLink(fullModel,local_28);
      this = (vector<long,std::allocator<long>> *)
             ((link2additionalFramesAdjacencyList->
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + LVar3);
      __position._M_current = *(long **)(this + 8);
      if (__position._M_current == *(long **)(this + 0x10)) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  (this,__position,(long *)&local_28);
      }
      else {
        *__position._M_current = local_28;
        *(long **)(this + 8) = __position._M_current + 1;
      }
      sVar2 = local_28 + 1;
      local_28 = sVar2;
      sVar1 = Model::getNrOfFrames(fullModel);
    } while ((long)sVar2 < (long)sVar1);
  }
  return;
}

Assistant:

void buildLinkToAdditionalFramesList(const Model& fullModel,
                                     std::vector< std::vector<FrameIndex> > & link2additionalFramesAdjacencyList)
{
    // Resize the data structure
    link2additionalFramesAdjacencyList.resize(fullModel.getNrOfLinks());

    // Iterate on all the frames and add them to the right link list
    for(FrameIndex additionalFrame = fullModel.getNrOfLinks();
        additionalFrame < (FrameIndex)fullModel.getNrOfFrames();
        additionalFrame++)
    {
        LinkIndex linkOfAdditionalFrame = fullModel.getFrameLink(additionalFrame);
        link2additionalFramesAdjacencyList[linkOfAdditionalFrame].push_back(additionalFrame);
    }
}